

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

int icount(uint v)

{
  int ret;
  
  ret = 0;
  for (; v != 0; v = v >> 1) {
    ret = ret + (v & 1);
  }
  return ret;
}

Assistant:

static int icount(unsigned int v){
  int ret=0;
  while(v){
    ret+=v&1;
    v>>=1;
  }
  return(ret);
}